

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanImplX11.cpp
# Opt level: O3

bool sf::priv::VulkanImplX11::isAvailable(bool requireGraphics)

{
  byte bVar1;
  pointer pVVar2;
  int iVar3;
  undefined1 *puVar4;
  byte bVar5;
  undefined7 in_register_00000039;
  pointer pVVar6;
  uint32_t extensionCount;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> extensionProperties;
  uint local_60;
  undefined4 local_5c;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> local_58;
  pointer local_38;
  
  if (isAvailable(bool)::checked != '\0') goto LAB_00196dce;
  isAvailable(bool)::checked = '\x01';
  if ((anonymous_namespace)::wrapper == 0) {
    (anonymous_namespace)::wrapper = dlopen("libvulkan.so.1",1);
    if ((anonymous_namespace)::wrapper != 0) {
      DAT_001ed030 = dlsym((anonymous_namespace)::wrapper,"vkGetInstanceProcAddr");
      if (((DAT_001ed030 != 0) &&
          (_DAT_001ed038 =
                dlsym((anonymous_namespace)::wrapper,"vkEnumerateInstanceLayerProperties"),
          _DAT_001ed038 != 0)) &&
         (DAT_001ed040 = (code *)dlsym((anonymous_namespace)::wrapper,
                                       "vkEnumerateInstanceExtensionProperties"),
         DAT_001ed040 != (code *)0x0)) goto LAB_00196c57;
      dlclose((anonymous_namespace)::wrapper);
      (anonymous_namespace)::wrapper = 0;
    }
    isAvailable(bool)::computeAvailable = 0;
    isAvailable(bool)::graphicsAvailable = 0;
    goto LAB_00196dce;
  }
LAB_00196c57:
  local_5c = (undefined4)CONCAT71(in_register_00000039,requireGraphics);
  isAvailable(bool)::computeAvailable = 1;
  isAvailable(bool)::graphicsAvailable = 1;
  local_58.super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60 = 0;
  (*DAT_001ed040)(0,&local_60,0);
  std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::resize
            (&local_58,(ulong)local_60);
  (*DAT_001ed040)(0,&local_60,
                  local_58.
                  super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
                  _M_impl.super__Vector_impl_data._M_start);
  pVVar2 = local_58.
           super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl
           .super__Vector_impl_data._M_finish;
  pVVar6 = local_58.
           super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (local_58.super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      local_58.super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
LAB_00196d12:
    isAvailable(bool)::graphicsAvailable = 0;
  }
  else {
    bVar5 = 0;
    bVar1 = 0;
    local_38 = local_58.
               super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
               _M_impl.super__Vector_impl_data._M_start;
    do {
      iVar3 = strcmp(pVVar6->extensionName,"VK_KHR_surface");
      if (iVar3 == 0) {
        bVar1 = 1;
      }
      else {
        iVar3 = strcmp(pVVar6->extensionName,"VK_KHR_xlib_surface");
        bVar5 = bVar5 | iVar3 == 0;
      }
      pVVar6 = pVVar6 + 1;
    } while (pVVar6 != pVVar2);
    pVVar6 = local_38;
    if (!(bool)(bVar1 & bVar5)) goto LAB_00196d12;
  }
  if (pVVar6 != (pointer)0x0) {
    operator_delete(pVVar6);
  }
  requireGraphics = SUB41(local_5c,0);
LAB_00196dce:
  puVar4 = &isAvailable(bool)::computeAvailable;
  if (requireGraphics != false) {
    puVar4 = &isAvailable(bool)::graphicsAvailable;
  }
  return (bool)*puVar4;
}

Assistant:

bool VulkanImplX11::isAvailable(bool requireGraphics)
{
    static bool checked = false;
    static bool computeAvailable = false;
    static bool graphicsAvailable = false;

    if (!checked)
    {
        checked = true;

        // Check if the library is available
        computeAvailable = wrapper.loadLibrary();

        // To check for instance extensions we don't need to differentiate between graphics and compute
        graphicsAvailable = computeAvailable;

        if (graphicsAvailable)
        {
            // Retrieve the available instance extensions
            std::vector<VkExtensionProperties> extensionProperties;

            uint32_t extensionCount = 0;

            wrapper.vkEnumerateInstanceExtensionProperties(0, &extensionCount, NULL);

            extensionProperties.resize(extensionCount);

            wrapper.vkEnumerateInstanceExtensionProperties(0, &extensionCount, &extensionProperties[0]);

            // Check if the necessary extensions are available
            bool has_VK_KHR_surface = false;
            bool has_VK_KHR_platform_surface = false;

            for (std::vector<VkExtensionProperties>::const_iterator iter = extensionProperties.begin(); iter != extensionProperties.end(); ++iter)
            {
                if (!std::strcmp(iter->extensionName, VK_KHR_SURFACE_EXTENSION_NAME))
                {
                    has_VK_KHR_surface = true;
                }
                else if (!std::strcmp(iter->extensionName, VK_KHR_XLIB_SURFACE_EXTENSION_NAME))
                {
                    has_VK_KHR_platform_surface = true;
                }
            }

            if (!has_VK_KHR_surface || !has_VK_KHR_platform_surface)
                graphicsAvailable = false;
        }
    }

    if (requireGraphics)
        return graphicsAvailable;

    return computeAvailable;
}